

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

BOOL __thiscall
Memory::Recycler::FinishConcurrentCollectWrapped(Recycler *this,CollectionFlags flags)

{
  int iVar1;
  
  this->allowDispose = (bool)((byte)(flags >> 0xf) & 1);
  this->skipStack = (bool)((byte)(flags >> 0x18) & 1);
  this->isConcurrentGCOnIdle = flags == CollectOnScriptIdle;
  iVar1 = (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[9])
                    (this->collectionWrapper,this,FinishConcurrentCollect,0);
  return iVar1;
}

Assistant:

BOOL
Recycler::FinishConcurrentCollectWrapped(CollectionFlags flags)
{
    this->allowDispose = (flags & CollectOverride_AllowDispose) == CollectOverride_AllowDispose;
#if ENABLE_CONCURRENT_GC
    this->skipStack = ((flags & CollectOverride_SkipStack) != 0);
    DebugOnly(this->isConcurrentGCOnIdle = (flags == CollectOnScriptIdle));
#endif
    BOOL collected = collectionWrapper->ExecuteRecyclerCollectionFunction(this, &Recycler::FinishConcurrentCollect, flags);
    return collected;
}